

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubVarSup.cpp
# Opt level: O3

ClauseIterator __thiscall Inferences::SubVarSup::generateClauses(SubVarSup *this,Clause *premise)

{
  long *plVar1;
  long *plVar2;
  int *piVar3;
  Ordering *pOVar4;
  Inference *pIVar5;
  bool bVar6;
  Clause *in_RDX;
  IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>
  *i;
  CatIterator<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>_>_>
  *i_00;
  byte bVar7;
  Value VVar8;
  Value VVar9;
  ForwardResultFn f;
  BackwardResultFn f_00;
  IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>
  itb;
  IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>
  itf;
  undefined1 local_5f8 [16];
  anon_class_8_1_54a39801_for__func local_5e8;
  ApplicableRewritesFn local_5e0;
  Clause *pCStack_5d8;
  Entry *local_5d0;
  Value VStack_5c8;
  bool local_5c0;
  Value local_5b8;
  char local_5b0;
  Value local_5a8;
  Value local_5a0;
  bool local_598;
  Value local_590;
  Value local_588;
  bool local_580;
  Value local_578;
  bool local_538;
  Value local_530;
  bool local_528;
  Value local_520;
  Clause *local_518;
  SubVarSup *pSStack_510;
  Clause *local_508;
  SubVarSupLHSIndex *local_500;
  Clause *pCStack_4f8;
  Entry *local_4f0;
  Value VStack_4e8;
  byte local_4e0;
  Value local_4d8;
  char local_4d0;
  Value local_4c8;
  undefined1 local_4c0 [48];
  Value VStack_490;
  bool local_488;
  Value local_480;
  bool local_478;
  Value local_470;
  Clause *local_468;
  SubVarSup *pSStack_460;
  Clause *local_458;
  SubVarSupLHSIndex *local_450;
  Clause *pCStack_448;
  Entry *local_440;
  Value VStack_438;
  byte local_430;
  Value local_428;
  char local_420;
  Value local_418;
  undefined1 local_410 [32];
  undefined1 local_3f0 [40];
  bool local_3c8;
  Value local_3c0;
  bool local_3a8;
  Value local_3a0;
  bool local_398;
  Value local_390;
  bool local_350;
  Value local_348;
  bool local_340;
  Value local_338;
  IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>_>
  local_330;
  IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>
  local_2d8;
  Clause *local_258;
  SubVarSup *pSStack_250;
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
  local_248;
  DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2> local_1d8;
  IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>
  local_1a8;
  IterTraits<Lib::FilteredIterator<Lib::CatIterator<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>_>_>,_Lib::NonzeroFn,_false>_>
  local_128;
  
  local_2d8._iter._inner._master._func._index._0_4_ = *(uint *)&in_RDX->field_0x3c & 0xfffff;
  local_2d8._iter._func._parent = (SubVarSup *)0x0;
  RewriteableSubtermsFn::RewriteableSubtermsFn
            ((RewriteableSubtermsFn *)&local_1d8,
             *(Ordering **)(*(long *)&(premise->super_Unit)._inference + 0xb8),in_RDX);
  Lib::
  IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>_>
  ::flatMap<Inferences::SubVarSup::RewriteableSubtermsFn>
            ((IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>_>
              *)local_410,
             (IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>_>
              *)&local_2d8,(RewriteableSubtermsFn *)&local_1d8);
  Lib::
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>_>
  ::flatMap<Inferences::SubVarSup::ApplicableRewritesFn>
            ((IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>_>
              *)local_5f8,
             (IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>_>
              *)local_410,(SubVarSupLHSIndex *)(premise->super_Unit)._inference._splits);
  f._parent = (SubVarSup *)premise;
  f._cl = in_RDX;
  Lib::
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>_>
  ::map<Inferences::SubVarSup::ForwardResultFn>
            (&local_1a8,
             (IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>_>
              *)local_5f8,f);
  if ((local_598 == true) &&
     (plVar2 = (long *)CONCAT71(local_590._1_7_,local_590._0_1_), plVar2 != (long *)0x0)) {
    plVar1 = plVar2 + 1;
    *(int *)plVar1 = (int)*plVar1 + -1;
    if ((int)*plVar1 == 0) {
      (**(code **)(*plVar2 + 8))();
    }
  }
  if (((bool)local_5a8._0_1_ == true) && (local_5a0 != (Value)0x0)) {
    plVar2 = (long *)((long)local_5a0 + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_5a0 + 8))();
    }
  }
  Lib::DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            ((DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2> *)
             (local_5f8 + 8));
  if ((local_3c8 == true) && (local_3c0 != (Value)0x0)) {
    plVar2 = (long *)((long)local_3c0 + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_3c0 + 8))();
    }
  }
  Lib::DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            ((DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2> *)local_410
            );
  Lib::DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            (&local_1d8);
  local_2d8._iter._inner._master._func._index._0_4_ = *(uint *)&in_RDX->field_0x3c & 0xfffff;
  local_2d8._iter._func._parent = (SubVarSup *)0x0;
  Lib::
  IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>_>
  ::flatMap<Kernel::EqHelper::SubVarSupLHSIteratorFn>
            ((IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>_>
              *)local_410,
             (IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>_>
              *)&local_2d8,*(Ordering **)(*(long *)&(premise->super_Unit)._inference + 0xb8));
  Lib::
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>_>
  ::flatMap<Inferences::SubVarSup::RewritableResultsFn>
            ((IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>_>
              *)local_5f8,
             (IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>_>
              *)local_410,*(SubVarSupSubtermIndex **)&(premise->super_Unit)._inference.field_0x8);
  f_00._parent = (SubVarSup *)premise;
  f_00._cl = in_RDX;
  Lib::
  IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>_>
  ::map<Inferences::SubVarSup::BackwardResultFn>
            ((IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>
              *)local_4c0,
             (IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>_>
              *)local_5f8,f_00);
  if ((local_5c0 == true) && (local_5b8 != (Value)0x0)) {
    piVar3 = (int *)((long)local_5b8 + 8);
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      (**(code **)(*(long *)local_5b8 + 8))();
    }
  }
  if ((local_5d0._0_1_ == true) && (VStack_5c8 != (Value)0x0)) {
    pOVar4 = (Ordering *)((long)VStack_5c8 + 8);
    *(int *)&pOVar4->_vptr_Ordering = *(int *)&pOVar4->_vptr_Ordering + -1;
    if (*(int *)&pOVar4->_vptr_Ordering == 0) {
      (*(*(_func_int ***)VStack_5c8)[1])();
    }
  }
  if ((local_3f0[0] == true) && ((Value)local_3f0._8_8_ != (Value)0x0)) {
    pOVar4 = (Ordering *)(local_3f0._8_8_ + 8);
    *(int *)&pOVar4->_vptr_Ordering = *(int *)&pOVar4->_vptr_Ordering + -1;
    if (*(int *)&pOVar4->_vptr_Ordering == 0) {
      (*(*(_func_int ***)local_3f0._8_8_)[1])();
    }
  }
  local_258 = local_1a8._iter._func._cl;
  pSStack_250 = local_1a8._iter._func._parent;
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
  ::FlatteningIterator(&local_248,&local_1a8._iter._inner);
  bVar6 = local_478;
  bVar7 = local_488;
  local_518 = (Clause *)local_4c0._0_8_;
  pSStack_510 = (SubVarSup *)local_4c0._8_8_;
  local_508 = (Clause *)local_4c0._16_8_;
  local_500 = (SubVarSupLHSIndex *)local_4c0._24_8_;
  pCStack_4f8 = (Clause *)local_4c0._32_8_;
  local_4f0 = (Entry *)local_4c0._40_8_;
  VStack_4e8 = VStack_490;
  local_4e0 = local_488;
  VVar8 = (Value)&local_1d8;
  if (local_488 == true) {
    local_4d8 = local_480;
    if (local_480 == (Value)0x0) {
      VVar8 = (Value)0x0;
    }
    else {
      *(int *)((long)local_480 + 8) = *(int *)((long)local_480 + 8) + 1;
      VVar8 = local_480;
    }
  }
  local_4d0 = local_478;
  if (local_478 == true) {
    local_4c8 = local_470;
    if (local_470 == (Value)0x0) {
      premise = (Clause *)0x0;
    }
    else {
      *(int *)((long)local_470 + 8) = *(int *)((long)local_470 + 8) + 1;
      premise = (Clause *)local_470;
    }
  }
  local_2d8._iter._func._cl = local_258;
  local_2d8._iter._func._parent = pSStack_250;
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>
  ::FlatteningIterator(&local_2d8._iter._inner,&local_248);
  local_468 = local_518;
  pSStack_460 = pSStack_510;
  local_458 = (Clause *)local_4c0._16_8_;
  local_450 = local_500;
  pCStack_448 = pCStack_4f8;
  local_440 = local_4f0;
  VStack_438 = VStack_4e8;
  local_430 = bVar7;
  if ((bool)bVar7 != false) {
    local_428 = VVar8;
    if (VVar8 == (Value)0x0) {
      VVar8 = (Value)0x0;
    }
    else {
      *(int *)((long)VVar8 + 8) = *(int *)((long)VVar8 + 8) + 1;
    }
  }
  local_420 = bVar6;
  VVar9 = (Value)premise;
  if (bVar6 != false) {
    local_418 = (Value)premise;
    if ((Value)premise == (Value)0x0) {
      VVar9 = (Value)0x0;
    }
    else {
      *(int *)((long)premise + 8) = *(int *)((long)premise + 8) + 1;
    }
  }
  local_5f8._0_8_ = local_518;
  local_5f8._8_8_ = pSStack_510;
  local_5e8.a = (Clause *)local_4c0._16_8_;
  local_5e0._index = local_500;
  pCStack_5d8 = pCStack_4f8;
  local_5d0 = local_4f0;
  VStack_5c8 = VStack_4e8;
  local_5c0 = (bool)bVar7;
  if (((bool)bVar7 != false) && (local_5b8 = VVar8, VVar8 != (Value)0x0)) {
    *(int *)((long)VVar8 + 8) = *(int *)((long)VVar8 + 8) + 1;
  }
  local_5b0 = bVar6;
  if ((bVar6 != false) && (local_5a8 = VVar9, VVar9 != (Value)0x0)) {
    *(int *)((long)VVar9 + 8) = *(int *)((long)VVar9 + 8) + 1;
  }
  Lib::
  iterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>,Kernel::EqHelper::SubVarSupLHSIteratorFn,Lib::VirtualIterator<std::pair<Kernel::Literal*,Kernel::TypedTermList>>>>,Inferences::SubVarSup::RewritableResultsFn,Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal*,Kernel::TypedTermList>,Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Indexing::TermLiteralClause>>>>>,Inferences::SubVarSup::BackwardResultFn,Kernel::Clause*>>>
            (&local_330,(Lib *)local_5f8,i);
  if ((local_5b0 == '\x01') && (local_5a8 != (Value)0x0)) {
    pIVar5 = (Inference *)((long)local_5a8 + 8);
    *(int *)pIVar5 = *(int *)pIVar5 + -1;
    if (*(int *)pIVar5 == 0) {
      (**(code **)(*(long *)local_5a8 + 8))();
    }
  }
  if ((local_5c0 == true) && (local_5b8 != (Value)0x0)) {
    piVar3 = (int *)((long)local_5b8 + 8);
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      (**(code **)(*(long *)local_5b8 + 8))();
    }
  }
  Lib::
  CatIterator<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>_>_>
  ::CatIterator((CatIterator<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>_>_>
                 *)local_5f8,&local_2d8,&local_330);
  Lib::
  iterTraits<Lib::CatIterator<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>,Inferences::SubVarSup::RewriteableSubtermsFn,Lib::VirtualIterator<std::pair<Kernel::Literal*,Kernel::TypedTermList>>>>,Inferences::SubVarSup::ApplicableRewritesFn,Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal*,Kernel::TypedTermList>,Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Indexing::TermLiteralClause>>>>>,Inferences::SubVarSup::ForwardResultFn,Kernel::Clause*>>,Lib::IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>,Kernel::EqHelper::SubVarSupLHSIteratorFn,Lib::VirtualIterator<std::pair<Kernel::Literal*,Kernel::TypedTermList>>>>,Inferences::SubVarSup::RewritableResultsFn,Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal*,Kernel::TypedTermList>,Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Indexing::TermLiteralClause>>>>>,Inferences::SubVarSup::BackwardResultFn,Kernel::Clause*>>>>>
            ((IterTraits<Lib::CatIterator<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>_>_>_>
              *)local_410,(Lib *)local_5f8,i_00);
  if ((local_528 == true) && (local_520 != (Value)0x0)) {
    plVar2 = (long *)((long)local_520 + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_520 + 8))();
    }
  }
  if ((local_538 == true) && (local_530 != (Value)0x0)) {
    plVar2 = (long *)((long)local_530 + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_530 + 8))();
    }
  }
  if ((local_580 == true) && (local_578 != (Value)0x0)) {
    plVar2 = (long *)((long)local_578 + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_578 + 8))();
    }
  }
  if ((local_590._0_1_ == '\x01') && (local_588 != (Value)0x0)) {
    plVar2 = (long *)((long)local_588 + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_588 + 8))();
    }
  }
  Lib::DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            ((DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2> *)
             &pCStack_5d8);
  if ((local_330._iter._iter._inner._current.
       super_OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
       ._isSome == true) &&
     (local_330._iter._iter._inner._current.
      super_OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
      ._elem._elem != (Value)0x0)) {
    plVar2 = (long *)((long)local_330._iter._iter._inner._current.
                            super_OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
                            ._elem._elem + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_330._iter._iter._inner._current.
                            super_OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
                            ._elem._elem + 8))();
    }
  }
  if ((local_330._iter._iter._inner._master._inner._current.
       super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>
       ._isSome == true) &&
     (local_330._iter._iter._inner._master._inner._current.
      super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>.
      _elem._elem != (Value)0x0)) {
    plVar2 = (long *)((long)local_330._iter._iter._inner._master._inner._current.
                            super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>
                            ._elem._elem + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_330._iter._iter._inner._master._inner._current.
                            super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>
                            ._elem._elem + 8))();
    }
  }
  if (VVar9 != (Value)0x0 && bVar6 == true) {
    pIVar5 = (Inference *)((long)VVar9 + 8);
    *(int *)pIVar5 = *(int *)pIVar5 + -1;
    if (*(int *)pIVar5 == 0) {
      (**(code **)(*(long *)VVar9 + 8))(VVar9);
      bVar7 = local_430;
    }
  }
  if (((bVar7 & 1) != 0) && (local_428 != (Value)0x0)) {
    piVar3 = (int *)((long)local_428 + 8);
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      (**(code **)(*(long *)local_428 + 8))();
    }
  }
  if ((local_2d8._iter._inner._current.
       super_OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
       ._isSome == true) &&
     (local_2d8._iter._inner._current.
      super_OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
      ._elem._elem != (Value)0x0)) {
    plVar2 = (long *)((long)local_2d8._iter._inner._current.
                            super_OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
                            ._elem._elem + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_2d8._iter._inner._current.
                            super_OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
                            ._elem._elem + 8))();
    }
  }
  if ((local_2d8._iter._inner._master._inner._current.
       super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>
       ._isSome == true) &&
     (local_2d8._iter._inner._master._inner._current.
      super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>.
      _elem._elem != (Value)0x0)) {
    plVar2 = (long *)((long)local_2d8._iter._inner._master._inner._current.
                            super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>
                            ._elem._elem + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_2d8._iter._inner._master._inner._current.
                            super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>
                            ._elem._elem + 8))();
    }
  }
  Lib::DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            ((DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2> *)
             &local_2d8._iter._inner._master._inner);
  Lib::
  IterTraits<Lib::CatIterator<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>_>_>_>
  ::filter<Lib::NonzeroFn>
            (&local_128,
             (IterTraits<Lib::CatIterator<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Inferences::SubVarSup::RewriteableSubtermsFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::ApplicableRewritesFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::ForwardResultFn,_Kernel::Clause_*>_>,_Lib::IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_Kernel::EqHelper::SubVarSupLHSIteratorFn,_Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>_>,_Inferences::SubVarSup::RewritableResultsFn,_Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>_>,_Inferences::SubVarSup::BackwardResultFn,_Kernel::Clause_*>_>_>_>_>
              *)local_410);
  Lib::
  pvi<Lib::IterTraits<Lib::FilteredIterator<Lib::CatIterator<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>,Inferences::SubVarSup::RewriteableSubtermsFn,Lib::VirtualIterator<std::pair<Kernel::Literal*,Kernel::TypedTermList>>>>,Inferences::SubVarSup::ApplicableRewritesFn,Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal*,Kernel::TypedTermList>,Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Indexing::TermLiteralClause>>>>>,Inferences::SubVarSup::ForwardResultFn,Kernel::Clause*>>,Lib::IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>,Kernel::EqHelper::SubVarSupLHSIteratorFn,Lib::VirtualIterator<std::pair<Kernel::Literal*,Kernel::TypedTermList>>>>,Inferences::SubVarSup::RewritableResultsFn,Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal*,Kernel::TypedTermList>,Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,Indexing::TermLiteralClause>>>>>,Inferences::SubVarSup::BackwardResultFn,Kernel::Clause*>>>>,Lib::NonzeroFn,false>>>
            ((Lib *)this,&local_128);
  if ((local_128._iter._inn._it2._iter._iter._inner._current.
       super_OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
       ._isSome == true) &&
     (local_128._iter._inn._it2._iter._iter._inner._current.
      super_OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
      ._elem._elem != (Value)0x0)) {
    plVar2 = (long *)((long)local_128._iter._inn._it2._iter._iter._inner._current.
                            super_OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
                            ._elem._elem + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_128._iter._inn._it2._iter._iter._inner._current.
                            super_OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
                            ._elem._elem + 8))();
    }
  }
  if ((local_128._iter._inn._it2._iter._iter._inner._master._inner._current.
       super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>
       ._isSome == true) &&
     (local_128._iter._inn._it2._iter._iter._inner._master._inner._current.
      super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>.
      _elem._elem != (Value)0x0)) {
    plVar2 = (long *)((long)local_128._iter._inn._it2._iter._iter._inner._master._inner._current.
                            super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>
                            ._elem._elem + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_128._iter._inn._it2._iter._iter._inner._master._inner._current.
                            super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>
                            ._elem._elem + 8))();
    }
  }
  if ((local_128._iter._inn._it1._iter._inner._current.
       super_OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
       ._isSome == true) &&
     (local_128._iter._inn._it1._iter._inner._current.
      super_OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
      ._elem._elem != (Value)0x0)) {
    plVar2 = (long *)((long)local_128._iter._inn._it1._iter._inner._current.
                            super_OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
                            ._elem._elem + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_128._iter._inn._it1._iter._inner._current.
                            super_OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
                            ._elem._elem + 8))();
    }
  }
  if ((local_128._iter._inn._it1._iter._inner._master._inner._current.
       super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>
       ._isSome == true) &&
     (local_128._iter._inn._it1._iter._inner._master._inner._current.
      super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>.
      _elem._elem != (Value)0x0)) {
    plVar2 = (long *)((long)local_128._iter._inn._it1._iter._inner._master._inner._current.
                            super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>
                            ._elem._elem + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_128._iter._inn._it1._iter._inner._master._inner._current.
                            super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>
                            ._elem._elem + 8))();
    }
  }
  Lib::DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            ((DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2> *)
             &local_128._iter._inn._it1._iter._inner._master._inner);
  if ((local_340 == true) && (local_338 != (Value)0x0)) {
    plVar2 = (long *)((long)local_338 + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_338 + 8))();
    }
  }
  if ((local_350 == true) && (local_348 != (Value)0x0)) {
    plVar2 = (long *)((long)local_348 + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_348 + 8))();
    }
  }
  if ((local_398 == true) && (local_390 != (Value)0x0)) {
    plVar2 = (long *)((long)local_390 + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_390 + 8))();
    }
  }
  if ((local_3a8 == true) && (local_3a0 != (Value)0x0)) {
    plVar2 = (long *)((long)local_3a0 + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_3a0 + 8))();
    }
  }
  Lib::DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            ((DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2> *)local_3f0
            );
  if ((local_4d0 == '\x01') && (local_4c8 != (Value)0x0)) {
    pIVar5 = (Inference *)((long)local_4c8 + 8);
    *(int *)pIVar5 = *(int *)pIVar5 + -1;
    if (*(int *)pIVar5 == 0) {
      (**(code **)(*(long *)local_4c8 + 8))();
    }
  }
  if ((local_4e0 == 1) && (local_4d8 != (Value)0x0)) {
    piVar3 = (int *)((long)local_4d8 + 8);
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      (**(code **)(*(long *)local_4d8 + 8))();
    }
  }
  if ((local_248._current.
       super_OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
       ._isSome == true) &&
     (local_248._current.
      super_OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
      ._elem._elem != (Value)0x0)) {
    plVar2 = (long *)((long)local_248._current.
                            super_OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
                            ._elem._elem + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_248._current.
                            super_OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
                            ._elem._elem + 8))();
    }
  }
  if ((local_248._master._inner._current.
       super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>
       ._isSome == true) &&
     (local_248._master._inner._current.
      super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>.
      _elem._elem != (Value)0x0)) {
    plVar2 = (long *)((long)local_248._master._inner._current.
                            super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>
                            ._elem._elem + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_248._master._inner._current.
                            super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>
                            ._elem._elem + 8))();
    }
  }
  Lib::DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            ((DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2> *)
             &local_248._master._inner);
  if ((local_478 == true) && (local_470 != (Value)0x0)) {
    pIVar5 = (Inference *)((long)local_470 + 8);
    *(int *)pIVar5 = *(int *)pIVar5 + -1;
    if (*(int *)pIVar5 == 0) {
      (**(code **)(*(long *)local_470 + 8))();
    }
  }
  if ((local_488 == true) && (local_480 != (Value)0x0)) {
    piVar3 = (int *)((long)local_480 + 8);
    *piVar3 = *piVar3 + -1;
    if (*piVar3 == 0) {
      (**(code **)(*(long *)local_480 + 8))();
    }
  }
  if ((local_1a8._iter._inner._current.
       super_OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
       ._isSome == true) &&
     (local_1a8._iter._inner._current.
      super_OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
      ._elem._elem != (Value)0x0)) {
    plVar2 = (long *)((long)local_1a8._iter._inner._current.
                            super_OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
                            ._elem._elem + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_1a8._iter._inner._current.
                            super_OptionBase<Lib::VirtualIterator<std::pair<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>,_Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>_>_>
                            ._elem._elem + 8))();
    }
  }
  if ((local_1a8._iter._inner._master._inner._current.
       super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>
       ._isSome == true) &&
     (local_1a8._iter._inner._master._inner._current.
      super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>.
      _elem._elem != (Value)0x0)) {
    plVar2 = (long *)((long)local_1a8._iter._inner._master._inner._current.
                            super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>
                            ._elem._elem + 8);
    *(int *)plVar2 = *(int *)plVar2 + -1;
    if (*(int *)plVar2 == 0) {
      (**(code **)(*(long *)local_1a8._iter._inner._master._inner._current.
                            super_OptionBase<Lib::VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TypedTermList>_>_>
                            ._elem._elem + 8))();
    }
  }
  Lib::DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
            ((DHMap<unsigned_int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2> *)
             &local_1a8._iter._inner._master._inner);
  return (ClauseIterator)(IteratorCore<Kernel::Clause_*> *)this;
}

Assistant:

ClauseIterator SubVarSup::generateClauses(Clause* premise)
{
  //cout << "SubVarSup with " << premise->toString() << endl;

  auto itf = iterTraits(premise->getSelectedLiteralIterator())
  // Get an iterator of pairs of selected literals and rewritable subterms of those literals
  // A subterm is rewritable (see EqHelper) if
  //  a) The literal is a positive equality t1=t2 and the subterm is max(t1,t2) wrt ordering
  //  b) The subterm is not a variable
     .flatMap(RewriteableSubtermsFn(_salg->getOrdering(), premise))

  // Get clauses with a literal whose complement unifies with the rewritable subterm,
  // returns a pair with the original pair and the unification result (includes substitution)
     .flatMap(ApplicableRewritesFn(_lhsIndex))

  //Perform forward SubVarSup
     .map(ForwardResultFn(premise, *this));

  auto itb = iterTraits(premise->getSelectedLiteralIterator())
             .flatMap(EqHelper::SubVarSupLHSIteratorFn(_salg->getOrdering()))
             .flatMap(RewritableResultsFn(_subtermIndex))
  //Perform backward SubVarSup
             .map(BackwardResultFn(premise, *this));

  // Add the results of forward and backward together
  return pvi(concatIters(std::move(itf),std::move(itb))
  // Remove null elements - these can come from performSubVarSup
          .filter(NonzeroFn()));
}